

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

int __thiscall gpu::Context::init(Context *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  
  return in_EAX;
}

Assistant:

void Context::init(int device)
{
#ifdef CUDA_SUPPORT
#ifndef CUDA_USE_PRIMARY_CONTEXT
	if (!cuda_api_init())
		throw cuda::cuda_exception("Can't load nvcuda library");
#endif
	std::shared_ptr<Data> data = std::make_shared<Data>();
	data->type				= TypeCUDA;
	data->cuda_device		= device;
	data_ref_	= data;
#endif
}